

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void Test_UserDefinedClass_logging::RunTest(void)

{
  bool bVar1;
  size_type t;
  string *psVar2;
  reference pvVar3;
  long lVar4;
  ostream *poVar5;
  UserDefinedClass *this;
  CheckOpString _result_1;
  CheckOpString _result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buf;
  UserDefinedClass u;
  UserDefinedClass *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  UserDefinedClass *in_stack_ffffffffffffff08;
  LogMessage *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  LogMessage *in_stack_ffffffffffffff20;
  LogMessage local_a0;
  CheckOpString local_90;
  byte local_81;
  LogMessage local_80;
  LogMessageVoidify local_69;
  LogMessage local_68;
  unsigned_long local_58;
  unsigned_long local_50;
  CheckOpString local_48 [3];
  LogMessage local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  UserDefinedClass local_1;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12f829);
  google::LogMessage::LogMessage
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(LogSeverity)in_stack_ffffffffffffff10,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff08);
  google::LogMessage::stream(&local_30);
  ::operator<<((ostream *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
  google::LogMessage::~LogMessage(in_stack_ffffffffffffff10);
  local_50 = google::GetReferenceableValue(1);
  t = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size(&local_20);
  local_58 = google::GetReferenceableValue(t);
  psVar2 = google::Check_EQImpl<unsigned_long,unsigned_long>
                     ((unsigned_long *)in_stack_ffffffffffffff08,
                      (unsigned_long *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                      ,(char *)in_stack_fffffffffffffef8);
  google::CheckOpString::CheckOpString(local_48,psVar2);
  bVar1 = google::CheckOpString::operator_cast_to_bool(local_48);
  if (bVar1) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff04,(CheckOpString *)in_stack_fffffffffffffef8);
    google::LogMessage::stream(&local_68);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LAB_0012f95d);
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&local_20,0);
  lVar4 = std::__cxx11::string::find((char *)pvVar3,0x162b87);
  local_81 = 0;
  if (lVar4 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_69);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char *)in_stack_fffffffffffffef8,0);
    local_81 = 1;
    poVar5 = google::LogMessage::stream(&local_80);
    poVar5 = std::operator<<(poVar5,"Check failed: buf[0].find(\"OK\") != string::npos ");
    google::LogMessageVoidify::operator&(&local_69,poVar5);
  }
  if ((local_81 & 1) != 0) {
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LAB_0012fa85);
  }
  google::GetReferenceableValue<UserDefinedClass>(&local_1);
  this = google::GetReferenceableValue<UserDefinedClass>(&local_1);
  psVar2 = google::Check_EQImpl<UserDefinedClass,UserDefinedClass>
                     (in_stack_ffffffffffffff08,
                      (UserDefinedClass *)
                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (char *)in_stack_fffffffffffffef8);
  google::CheckOpString::CheckOpString(&local_90,psVar2);
  bVar1 = google::CheckOpString::operator_cast_to_bool(&local_90);
  if (bVar1) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)this,(char *)psVar2,
               CONCAT13(bVar1,(int3)in_stack_ffffffffffffff04),
               (CheckOpString *)in_stack_fffffffffffffef8);
    google::LogMessage::stream(&local_a0);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LAB_0012fb51);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  return;
}

Assistant:

TEST(UserDefinedClass, logging) {
  UserDefinedClass u;
  vector<string> buf;
  LOG_STRING(INFO, &buf) << u;
  CHECK_EQ(1UL, buf.size());
  CHECK(buf[0].find("OK") != string::npos);

  // We must be able to compile this.
  CHECK_EQ(u, u);
}